

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Track::VetEntry(Track *this,BlockEntry *pBlockEntry)

{
  Block *this_00;
  longlong lVar1;
  long *in_RSI;
  long in_RDI;
  Block *pBlock;
  
  this_00 = (Block *)(**(code **)(*in_RSI + 0x10))();
  if ((this_00 != (Block *)0x0) &&
     (lVar1 = Block::GetTrackNumber(this_00), lVar1 == *(long *)(in_RDI + 0x28))) {
    return true;
  }
  return false;
}

Assistant:

bool Track::VetEntry(const BlockEntry* pBlockEntry) const {
  assert(pBlockEntry);
  const Block* const pBlock = pBlockEntry->GetBlock();
  assert(pBlock);
  assert(pBlock->GetTrackNumber() == m_info.number);
  if (!pBlock || pBlock->GetTrackNumber() != m_info.number)
    return false;

  // This function is used during a seek to determine whether the
  // frame is a valid seek target.  This default function simply
  // returns true, which means all frames are valid seek targets.
  // It gets overridden by the VideoTrack class, because only video
  // keyframes can be used as seek target.

  return true;
}